

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  void *pvVar1;
  WirePointer *pWVar2;
  StructPointerCount SVar3;
  undefined1 *puVar4;
  uint uVar5;
  unsigned_short *puVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  ElementCount EVar10;
  size_t elementCount;
  ElementCount EVar11;
  ulong uVar12;
  Validator *pVVar13;
  uint64_t id;
  SegmentReader *pSVar14;
  char *pcVar15;
  char *pcVar16;
  int iVar17;
  bool bVar18;
  bool fieldIsPointer;
  uint dataSizeInBits;
  uint pointerCount;
  uint fieldBits;
  Reader field;
  Array<bool> sawDiscriminantValue_heap;
  Array<bool> sawCodeOrder_heap;
  anon_class_8_1_a7e8901a _kjContextFunc338;
  Fault f;
  Fault f_3;
  Reader fields;
  bool sawDiscriminantValue_stack [32];
  bool sawCodeOrder_stack [32];
  bool local_299;
  uint local_298;
  uint local_294;
  Reader *local_290;
  char *local_288;
  int local_27c;
  uint local_278;
  uint local_274;
  anon_class_8_1_6f242a07 local_270;
  StructReader local_268;
  ulong local_238;
  ulong local_230;
  ElementCount local_224;
  uint local_220;
  ElementCount local_21c;
  uint64_t local_218;
  ulong local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  ulong local_1f8;
  ushort *local_1f0;
  undefined1 *local_1e8;
  ulong uStack_1e0;
  undefined8 *local_1d8;
  char *local_1c8;
  ulong uStack_1c0;
  undefined8 *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  size_t local_198;
  Validator *local_190;
  Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
  *local_188;
  StructReader *local_180;
  PointerReader local_178;
  ArrayPtr<const_char> local_158;
  WirePointer *local_148;
  int local_140;
  undefined1 local_128 [24];
  int local_110;
  StructReader **local_e0;
  ArrayPtr<const_char> local_d8;
  WirePointer *local_c8;
  int local_c0;
  ListReader local_a8;
  undefined1 local_78 [32];
  char local_58 [40];
  
  uVar5 = (structNode->_reader).dataSize;
  if (uVar5 < 0x80) {
    local_294 = 0;
    local_278 = 0;
  }
  else {
    pvVar1 = (structNode->_reader).data;
    local_294 = (uint)*(ushort *)((long)pvVar1 + 0xe) << 6;
    local_278 = 0;
    if (0xcf < uVar5) {
      local_278 = (uint)*(ushort *)((long)pvVar1 + 0x18);
    }
  }
  bVar18 = (structNode->_reader).pointerCount < 4;
  local_128._16_8_ = (structNode->_reader).pointers + 3;
  if (bVar18) {
    local_128._16_8_ = (WirePointer *)0x0;
  }
  local_110 = (structNode->_reader).nestingLimit;
  if (bVar18) {
    local_128._0_4_ = 0;
    local_128._4_4_ = 0;
    local_128._8_4_ = 0;
    local_128._12_4_ = 0;
    local_110 = 0x7fffffff;
  }
  else {
    local_128._0_4_ = *(undefined4 *)&(structNode->_reader).segment;
    local_128._4_4_ = *(undefined4 *)((long)&(structNode->_reader).segment + 4);
    local_128._8_4_ = *(undefined4 *)&(structNode->_reader).capTable;
    local_128._12_4_ = *(undefined4 *)((long)&(structNode->_reader).capTable + 4);
  }
  local_290 = structNode;
  _::PointerReader::getList(&local_a8,(PointerReader *)local_128,INLINE_COMPOSITE,(word *)0x0);
  local_238 = (ulong)local_a8.elementCount;
  if (local_238 < 0x21) {
    local_1c8 = (char *)0x0;
    uStack_1c0 = 0;
    local_1b8 = (undefined8 *)0x0;
    local_288 = local_58;
    local_208 = (undefined8 *)0x0;
  }
  else {
    local_288 = (char *)kj::_::HeapArrayDisposer::allocateImpl
                                  (1,local_238,local_238,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
    local_208 = &kj::_::HeapArrayDisposer::instance;
    local_1b8 = &kj::_::HeapArrayDisposer::instance;
    local_1c8 = local_288;
    uStack_1c0 = local_238;
  }
  pcVar16 = local_1c8;
  local_210 = uStack_1c0;
  memset(local_288,0,local_238);
  if ((local_290->_reader).dataSize < 0x100) {
    elementCount = 0;
LAB_00162ec9:
    local_1e8 = (undefined1 *)0x0;
    uStack_1e0 = 0;
    local_1d8 = (undefined8 *)0x0;
    local_1a0 = local_78;
    local_200 = (undefined8 *)0x0;
  }
  else {
    elementCount = (size_t)*(ushort *)((long)(local_290->_reader).data + 0x1e);
    if (elementCount < 0x21) goto LAB_00162ec9;
    local_1a0 = (undefined1 *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                           (_func_void_void_ptr *)0x0);
    local_200 = &kj::_::HeapArrayDisposer::instance;
    local_1d8 = &kj::_::HeapArrayDisposer::instance;
    local_1e8 = local_1a0;
    uStack_1e0 = elementCount;
  }
  puVar4 = local_1e8;
  local_1f8 = uStack_1e0;
  local_198 = elementCount;
  memset(local_1a0,0,elementCount);
  uVar5 = (local_290->_reader).dataSize;
  local_1b0 = pcVar16;
  local_1a8 = puVar4;
  if (0xff < uVar5) {
    pvVar1 = (local_290->_reader).data;
    uVar8 = *(ushort *)((long)pvVar1 + 0x1e);
    if (uVar8 != 0) {
      if (uVar8 == 1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
                  ((Fault *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x143,FAILED,"structNode.getDiscriminantCount() != 1",
                   "\"union must have at least two members\"",
                   (char (*) [37])"union must have at least two members");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)local_128);
        goto LAB_001636c6;
      }
      if (local_a8.elementCount < uVar8) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                  ((Fault *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x145,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                   "\"struct can\'t have more union fields than total fields\"",
                   (char (*) [54])"struct can\'t have more union fields than total fields");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)local_128);
        goto LAB_001636c6;
      }
      uVar9 = 0x10;
      if (0x11f < uVar5) {
        uVar9 = *(int *)((long)pvVar1 + 0x20) * 0x10 + 0x10;
      }
      if (local_294 < uVar9) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                  ((Fault *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x148,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                   "\"union discriminant is out-of-bounds\"",
                   (char (*) [36])"union discriminant is out-of-bounds");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)local_128);
        goto LAB_001636c6;
      }
    }
  }
  uVar12 = (ulong)local_a8.elementCount;
  puVar6 = (unsigned_short *)kj::Arena::allocateBytes(&this->loader->arena,uVar12 * 2,2,false);
  (this->membersByDiscriminant).ptr = puVar6;
  (this->membersByDiscriminant).size_ = uVar12;
  uVar5 = (local_290->_reader).dataSize;
  EVar11 = 0;
  if (0xff < uVar5) {
    EVar11 = (ElementCount)*(ushort *)((long)(local_290->_reader).data + 0x1e);
  }
  local_274 = 0;
  local_224 = local_a8.elementCount;
  local_218 = scopeId;
  if (local_a8.elementCount == 0) {
    uVar9 = 0;
  }
  else {
    local_188 = (Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                 *)&this->members;
    local_230 = 0;
    local_27c = 0;
    local_298 = 0;
    EVar10 = 0;
    uVar12 = local_238;
    pcVar16 = local_288;
    local_190 = this;
    do {
      local_21c = EVar10;
      _::ListReader::getStructElement(&local_268,&local_a8,EVar10);
      local_180 = &local_268;
      kj::_::Debug::Context::Context((Context *)local_128);
      local_128._0_8_ = &PTR__Context_001c5fc0;
      local_e0 = &local_180;
      local_c0 = local_268.nestingLimit;
      local_c8 = local_268.pointers;
      if (local_268.pointerCount == 0) {
        local_c8 = (WirePointer *)0x0;
        local_c0 = 0x7fffffff;
      }
      local_d8.ptr._0_4_ = 0;
      local_d8.ptr._4_4_ = 0;
      local_d8.size_._0_4_ = 0;
      local_d8.size_._4_4_ = 0;
      if (local_268.pointerCount != 0) {
        local_d8.ptr._0_4_ = local_268.segment._0_4_;
        local_d8.ptr._4_4_ = local_268.segment._4_4_;
        local_d8.size_._0_4_ = local_268.capTable._0_4_;
        local_d8.size_._4_4_ = local_268.capTable._4_4_;
      }
      local_158 = (ArrayPtr<const_char>)
                  _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_d8,(void *)0x0,0);
      local_178.segment = (SegmentReader *)&local_158;
      local_c8 = (WirePointer *)CONCAT44(local_c8._4_4_,local_27c);
      local_270.update = (anon_class_16_2_3f8e8a0c *)&local_178;
      local_178.capTable = (CapTableReader *)this;
      local_d8 = local_158;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                (local_188,(Entry *)&local_d8,&local_270);
      iVar17 = local_268.nestingLimit;
      SVar3 = local_268.pointerCount;
      pWVar2 = local_268.pointers;
      pSVar14 = local_268.segment;
      pcVar15 = local_288;
      if (local_268.dataSize < 0x10) {
        if (((uint)uVar12 == 0) || (*pcVar16 != '\0')) goto LAB_0016351e;
        uVar7 = 0;
LAB_001631d2:
        pcVar16[uVar7] = '\x01';
        uVar5 = local_298;
        if (local_268.dataSize < 0x60) {
          if (0x1f < local_268.dataSize) goto LAB_0016322f;
LAB_00163280:
          local_298 = uVar5;
          if (local_a8.elementCount < EVar11) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                      ((Fault *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x16a,FAILED,"nonDiscriminantPos <= fields.size()",
                       "\"discriminantCount did not match fields\"",
                       (char (*) [39])"discriminantCount did not match fields");
            pcVar16 = local_288;
            this->isValid = false;
            kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
          }
          else {
            EVar10 = EVar11 + 1;
            uVar9 = EVar11;
LAB_00163294:
            (this->membersByDiscriminant).ptr[uVar9] = (unsigned_short)local_27c;
            EVar11 = EVar10;
            if (0x4f < local_268.dataSize) {
              if (*(ushort *)((long)local_268.data + 8) == 1) {
                if (local_268.dataSize < 0xc0) {
                  id = 0;
                }
                else {
                  id = *(uint64_t *)((long)local_268.data + 0x10);
                }
                validateTypeId(this,id,STRUCT);
              }
              else if (*(ushort *)((long)local_268.data + 8) == 0) goto LAB_001632c4;
LAB_001634dd:
              local_27c = local_27c + 1;
              bVar18 = true;
              pcVar16 = pcVar15;
              goto LAB_001634e6;
            }
LAB_001632c4:
            pVVar13 = (Validator *)CONCAT44(local_268.capTable._4_4_,local_268.capTable._0_4_);
            local_1f0 = (ushort *)local_268.data;
            local_220 = local_268.dataSize;
            local_270.update = local_270.update & 0xffffffff00000000;
            local_299 = false;
            if (local_268.pointerCount < 3) {
              local_140 = 0x7fffffff;
              local_158.size_ = 0;
              local_148 = (WirePointer *)0x0;
              local_158.ptr = (char *)0x0;
            }
            else {
              local_148 = local_268.pointers + 2;
              local_158.size_ = (size_t)pVVar13;
              local_158.ptr = (char *)local_268.segment;
              local_140 = local_268.nestingLimit;
            }
            _::PointerReader::getStruct
                      ((StructReader *)&local_d8,(PointerReader *)&local_158,(word *)0x0);
            uVar12 = local_238;
            if (SVar3 < 4) {
              iVar17 = 0x7fffffff;
              pVVar13 = (Validator *)0x0;
              local_178.pointer = (WirePointer *)0x0;
              pSVar14 = (SegmentReader *)0x0;
            }
            else {
              local_178.pointer = pWVar2 + 3;
            }
            local_178.segment = pSVar14;
            local_178.capTable = (CapTableReader *)pVVar13;
            local_178.nestingLimit = iVar17;
            _::PointerReader::getStruct((StructReader *)&local_158,&local_178,(word *)0x0);
            this = local_190;
            validate(local_190,(Reader *)&local_d8,(Reader *)&local_158,(uint *)&local_270,
                     &local_299);
            pcVar16 = local_288;
            pcVar15 = local_288;
            if (local_220 < 0x40) {
              if (((uint)local_270.update <= local_294) && (local_299 <= local_278))
              goto LAB_001634dd;
              iVar17 = 0;
            }
            else {
              iVar17 = *(int *)(local_1f0 + 2);
              if ((uint)local_270.update * (iVar17 + 1) <= local_294) {
                if ((iVar17 + 1) * (uint)local_299 <= local_278) goto LAB_001634dd;
                iVar17 = *(int *)(local_1f0 + 2);
              }
            }
            local_158.ptr._0_4_ = iVar17;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                      ((Fault *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x178,FAILED,
                       "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                       ,
                       "\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                       ,(char (*) [27])"field offset out-of-bounds",(uint *)&local_158,&local_294,
                       &local_278);
            this->isValid = false;
            kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
          }
          goto LAB_001635e8;
        }
        if (*(ushort *)((long)local_268.data + 10) != 1) {
LAB_0016322f:
          if (*(ushort *)((long)local_268.data + 2) == 0) goto LAB_00163280;
          uVar8 = ~*(ushort *)((long)local_268.data + 2);
          if (((uint)local_198 <= uVar8) || (local_1a0[uVar8] == '\x01')) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                      ((Fault *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x164,FAILED,
                       "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                       ,"\"invalid discriminantValue\"",(char (*) [26])"invalid discriminantValue");
            this->isValid = false;
            kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
            local_298 = uVar5;
            goto LAB_0016362d;
          }
          local_1a0[uVar8] = 1;
          uVar9 = (uint)local_230;
          local_230 = (ulong)(uVar9 + 1);
          EVar10 = EVar11;
          local_298 = uVar5;
          goto LAB_00163294;
        }
        if (local_268.dataSize < 0x70) {
          uVar5 = 1;
          if (local_298 == 0) goto LAB_0016322f;
        }
        else if (local_298 <= *(ushort *)((long)local_268.data + 0xc)) {
          uVar5 = *(ushort *)((long)local_268.data + 0xc) + 1;
          goto LAB_0016322f;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
                  ((Fault *)&local_d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x15d,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                   "\"fields were not ordered by ordinal\"",
                   (char (*) [35])"fields were not ordered by ordinal");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
LAB_0016362d:
        bVar18 = false;
        pcVar16 = local_288;
      }
      else {
        uVar7 = (ulong)*local_268.data;
        if (((uint)*local_268.data < (uint)uVar12) && (pcVar16[uVar7] == '\0')) goto LAB_001631d2;
LAB_0016351e:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                  ((Fault *)&local_d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x157,FAILED,
                   "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                   ,"\"invalid codeOrder\"",(char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
LAB_001635e8:
        bVar18 = false;
      }
LAB_001634e6:
      kj::_::Debug::Context::~Context((Context *)local_128);
      if (!bVar18) goto LAB_001636c6;
      EVar10 = local_21c + 1;
    } while (local_224 != EVar10);
    uVar5 = (local_290->_reader).dataSize;
    uVar9 = (uint)local_230;
  }
  if (0xff < uVar5) {
    local_274 = (uint)*(ushort *)((long)(local_290->_reader).data + 0x1e);
  }
  if (uVar9 != local_274) {
    local_268.segment = (SegmentReader *)0x0;
    local_128._0_8_ = (Exception *)0x0;
    local_128._8_8_ = (ExceptionCallback *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_268,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_268);
  }
  if (EVar11 != local_a8.elementCount) {
    local_268.segment = (SegmentReader *)0x0;
    local_128._0_8_ = (Exception *)0x0;
    local_128._8_8_ = (ExceptionCallback *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_268,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_268);
  }
  if ((0xe0 < uVar5) &&
     (pvVar1 = (local_290->_reader).data, (*(byte *)((long)pvVar1 + 0x1c) & 1) != 0)) {
    if (local_218 == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
                ((Fault *)local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x18b,FAILED,"scopeId != 0","\"group node missing scopeId\"",
                 (char (*) [27])"group node missing scopeId");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault((Fault *)local_128);
    }
    else {
      Impl::requireStructSize
                (this->loader,local_218,(uint)*(ushort *)((long)pvVar1 + 0xe),
                 (uint)*(ushort *)((long)pvVar1 + 0x18));
      validateTypeId(this,local_218,STRUCT);
    }
  }
LAB_001636c6:
  if (local_1a8 != (undefined1 *)0x0) {
    local_1e8 = (undefined1 *)0x0;
    uStack_1e0 = 0;
    (**(code **)*local_200)(local_200,local_1a8,1,local_1f8,local_1f8,0);
  }
  if (local_1b0 != (char *)0x0) {
    local_1c8 = (char *)0x0;
    uStack_1c0 = 0;
    (**(code **)*local_208)(local_208,local_1b0,1,local_210,local_210,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }